

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O3

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char examplestr [303];
  char helpstr [352];
  undefined1 auStack_2a8 [304];
  undefined1 local_178 [352];
  
  memcpy(local_178,
         "Description: \n\nGiven a set of MLLR transform, mllr_transform can transform \nthe mean according to formulat y=Ax+b.\n \n The output and input files are specified by -outmeanfn and \n -inmeanfn respectively. You may also transform the context-\ndependent model using the option -cdonly.  In that case you \nneed to specify a model definition using -moddeffn."
         ,0x160);
  memcpy(auStack_2a8,
         "Example: \n  The simplest case: \n  mllr_transform -inmeanfn inMeans -outmeanfn outMeans  -mllrmat matrix \n  \n  Adapt only on CD phones: \n  mllr_transform  -inmeanfn inMeans -outmeanfn outMeans  -mllrmat matrix -cdonly yes -moddeffn mdef \n  \n  Help and example: \n  nmllr_transform -help yes -example yes "
         ,0x12f);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",local_178);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",auStack_2a8);
  }
  if ((int)lVar3 == 0 && (int)lVar2 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/parse_cmd_ln.c"
          ,0x38,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;
#include "cmd_ln_defn.h"

    cmd_ln_parse(defn, argc, argv, TRUE);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }
    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }

    return 0;
}